

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteSInt32
               (int field_number,int32_t value,CodedOutputStream *output)

{
  bool bVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = field_number << 3;
  pbVar2 = output->cur_;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  output->cur_ = pbVar2;
  uVar4 = uVar3;
  if (0x7f < uVar3) {
    do {
      *pbVar2 = (byte)uVar4 | 0x80;
      uVar3 = uVar4 >> 7;
      pbVar2 = pbVar2 + 1;
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar3;
    } while (bVar1);
  }
  *pbVar2 = (byte)uVar3;
  pbVar2 = pbVar2 + 1;
  output->cur_ = pbVar2;
  uVar3 = value >> 0x1f ^ value * 2;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  output->cur_ = pbVar2;
  uVar4 = uVar3;
  if (0x7f < uVar3) {
    do {
      *pbVar2 = (byte)uVar4 | 0x80;
      uVar3 = uVar4 >> 7;
      pbVar2 = pbVar2 + 1;
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar3;
    } while (bVar1);
  }
  *pbVar2 = (byte)uVar3;
  output->cur_ = pbVar2 + 1;
  return;
}

Assistant:

void WireFormatLite::WriteSInt32(int field_number, int32_t value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteSInt32NoTag(value, output);
}